

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

int __thiscall CVmDynFuncVMIfc::validate_pool_list(CVmDynFuncVMIfc *this,uint32_t ofs)

{
  ushort uVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  iVar3 = CVmPoolInMem::validate_ofs(&G_const_pool_X,ofs);
  iVar5 = 0;
  if ((iVar3 != 0) && (iVar3 = CVmPoolInMem::validate_ofs(&G_const_pool_X,ofs + 1), iVar3 != 0)) {
    pcVar2 = G_const_pool_X.super_CVmPoolPaged.pages_
             [ofs >> ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem;
    uVar6 = (ulong)(G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & ofs);
    uVar1 = *(ushort *)(pcVar2 + uVar6);
    iVar3 = CVmPoolInMem::validate_ofs(&G_const_pool_X,ofs + (uint)uVar1 + (uint)uVar1 * 4 + 1);
    iVar5 = 0;
    if (iVar3 != 0) {
      iVar5 = 1;
      for (lVar4 = 0; (ulong)uVar1 * 5 != lVar4; lVar4 = lVar4 + 5) {
        if (0x12 < (byte)pcVar2[lVar4 + uVar6 + 2]) {
          return 0;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

virtual int validate_pool_list(uint32_t ofs)
    {
        /* establish globals */
        VMGLOB_PTR(vmg);

        /* validate the starting offset and full length prefix */
        if (!G_const_pool->validate_ofs(ofs)
            || !G_const_pool->validate_ofs(ofs+1))
            return FALSE;

        /* get the length */
        const char *p = G_const_pool->get_ptr(ofs);
        size_t len = vmb_get_len(p);
        p += VMB_LEN;

        /* make sure the end of the string is valid as well */
        if (!G_const_pool->validate_ofs(
            ofs + VMB_LEN + (len*VMB_DATAHOLDER) - 1))
            return FALSE;

        /* validate that each element is valid */
        for ( ; len != 0 ; p += VMB_DATAHOLDER, --len)
        {
            if (*p < 0 || *p >= (int)VM_FIRST_INVALID_TYPE)
                return FALSE;
        }

        /* success */
        return TRUE;
    }